

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O2

void Env_bcast_string(Env *env,char *data,int len,int root)

{
  return;
}

Assistant:

void Env_bcast_string( Env* env, char* data, int len, int root )
{
  Assert( Env_mpi_are_values_set_( env ) );
#ifdef USE_MPI
  const int mpi_code = MPI_Bcast( data, len, MPI_CHAR, root,
                                                Env_mpi_active_comm_( env ) );
  Assert( mpi_code == MPI_SUCCESS );
#endif
}